

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParsingConstructor
          (ImmutableMessageGenerator *this,Printer *printer)

{
  scoped_array<const_google::protobuf::FieldDescriptor_*> sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type type;
  WireType type_00;
  FieldDescriptor **ppFVar5;
  string *value;
  FieldDescriptor *field_00;
  ImmutableFieldGenerator *pIVar6;
  int i_00;
  int i_01;
  ulong uVar7;
  ulong extraout_RDX;
  FieldDescriptor *field_2;
  undefined1 local_c8 [4];
  int i_3;
  uint32 local_a4;
  undefined1 local_a0 [4];
  uint32 packed_tag;
  uint32 local_7c;
  FieldDescriptor *pFStack_78;
  uint32 tag;
  FieldDescriptor *field_1;
  undefined1 local_68 [4];
  int i_2;
  uint local_48;
  int local_44;
  int i_1;
  int totalBuilderInts;
  ImmutableFieldGenerator *field;
  int local_30;
  int i;
  int totalBuilderBits;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_20;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  sorted_fields.array_ = (FieldDescriptor **)printer;
  ppFVar5 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array(&local_20,ppFVar5)
  ;
  sVar1 = sorted_fields;
  value = Descriptor::name_abi_cxx11_((this->super_MessageGenerator).descriptor_);
  io::Printer::Print((Printer *)sVar1.array_,
                     "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",value);
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"this();\n");
  local_30 = 0;
  for (field._4_4_ = 0; iVar4 = field._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar3;
      field._4_4_ = field._4_4_ + 1) {
    field_00 = Descriptor::field((this->super_MessageGenerator).descriptor_,field._4_4_);
    _i_1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field_00);
    iVar4 = (*_i_1->_vptr_ImmutableFieldGenerator[3])();
    local_30 = iVar4 + local_30;
  }
  local_44 = (local_30 + 0x1f) / 0x20;
  uVar7 = (long)(local_30 + 0x1f) % 0x20 & 0xffffffff;
  for (local_48 = 0; sVar1.array_ = sorted_fields.array_, (int)local_48 < local_44;
      local_48 = local_48 + 1) {
    GetBitFieldName_abi_cxx11_((string *)local_68,(java *)(ulong)local_48,(int)uVar7);
    io::Printer::Print((Printer *)sVar1.array_,"int mutable_$bit_field_name$ = 0;\n",
                       "bit_field_name",(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    uVar7 = extraout_RDX;
  }
  bVar2 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n    com.google.protobuf.UnknownFieldSet.newBuilder();\n"
                      );
  }
  io::Printer::Print((Printer *)sorted_fields.array_,"try {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"int tag = input.readTag();\nswitch (tag) {\n")
  ;
  io::Printer::Indent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"case 0:\n  done = true;\n  break;\n");
  bVar2 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "default: {\n  if (!parseUnknownField(input, unknownFields,\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
                      );
  }
  else {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "default: {\n  if (!input.skipField(tag)) {\n    done = true;\n  }\n  break;\n}\n"
                      );
  }
  for (field_1._4_4_ = 0; iVar4 = field_1._4_4_,
      iVar3 = Descriptor::field_count((this->super_MessageGenerator).descriptor_), iVar4 < iVar3;
      field_1._4_4_ = field_1._4_4_ + 1) {
    ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&local_20,(long)field_1._4_4_);
    pFStack_78 = *ppFVar5;
    iVar4 = FieldDescriptor::number(pFStack_78);
    type = FieldDescriptor::type(pFStack_78);
    type_00 = internal::WireFormat::WireTypeForFieldType(type);
    local_7c = internal::WireFormatLite::MakeTag(iVar4,type_00);
    sVar1 = sorted_fields;
    SimpleItoa_abi_cxx11_((string *)local_a0,(protobuf *)(ulong)local_7c,i_00);
    io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    io::Printer::Indent((Printer *)sorted_fields.array_);
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,pFStack_78);
    (*pIVar6->_vptr_ImmutableFieldGenerator[0xb])(pIVar6,sorted_fields.array_);
    io::Printer::Outdent((Printer *)sorted_fields.array_);
    io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    bVar2 = FieldDescriptor::is_packable(pFStack_78);
    if (bVar2) {
      iVar4 = FieldDescriptor::number(pFStack_78);
      local_a4 = internal::WireFormatLite::MakeTag(iVar4,WIRETYPE_LENGTH_DELIMITED);
      sVar1 = sorted_fields;
      SimpleItoa_abi_cxx11_((string *)local_c8,(protobuf *)(ulong)local_a4,i_01);
      io::Printer::Print((Printer *)sVar1.array_,"case $tag$: {\n","tag",(string *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      io::Printer::Indent((Printer *)sorted_fields.array_);
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (&this->field_generators_,pFStack_78);
      (*pIVar6->_vptr_ImmutableFieldGenerator[0xc])(pIVar6,sorted_fields.array_);
      io::Printer::Outdent((Printer *)sorted_fields.array_);
      io::Printer::Print((Printer *)sorted_fields.array_,"  break;\n}\n");
    }
  }
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"  }\n}\n");
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(this);\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e).setUnfinishedMessage(this);\n} finally {\n"
                    );
  io::Printer::Indent((Printer *)sorted_fields.array_);
  for (field_2._4_4_ = 0;
      iVar4 = Descriptor::field_count((this->super_MessageGenerator).descriptor_),
      field_2._4_4_ < iVar4; field_2._4_4_ = field_2._4_4_ + 1) {
    ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&local_20,(long)field_2._4_4_);
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,*ppFVar5);
    (*pIVar6->_vptr_ImmutableFieldGenerator[0xd])(pIVar6,sorted_fields.array_);
  }
  bVar2 = PreserveUnknownFields((this->super_MessageGenerator).descriptor_);
  if (bVar2) {
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "this.unknownFields = unknownFields.build();\n");
  }
  io::Printer::Print((Printer *)sorted_fields.array_,"makeExtensionsImmutable();\n");
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Outdent((Printer *)sorted_fields.array_);
  io::Printer::Print((Printer *)sorted_fields.array_,"  }\n}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_20);
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateParsingConstructor(io::Printer* printer) {
  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "this();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n");

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "default: {\n"
      "  if (!parseUnknownField(input, unknownFields,\n"
      "                         extensionRegistry, tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  } else {
    printer->Print(
      "default: {\n"
      "  if (!input.skipField(tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(static_cast<int32>(tag)));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(static_cast<int32>(packed_tag)));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  if (PreserveUnknownFields(descriptor_)) {
    // Make unknown fields immutable.
    printer->Print("this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}